

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O2

istream * amrex::operator>>(istream *is,RealDescriptor *rd)

{
  int i;
  long lVar1;
  long lVar2;
  char c_2;
  char c;
  Vector<int,_std::allocator<int>_> ord;
  Vector<long,_std::allocator<long>_> fmt;
  int size;
  char local_8a;
  char local_89;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<long,_std::allocator<long>_> local_68;
  RealDescriptor local_50;
  
  std::operator>>(is,&local_89);
  if (local_89 != '(') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \'(\'");
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (Long *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88._M_impl.super__Vector_impl_data._M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_50);
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88._M_impl.super__Vector_impl_data._M_start != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88._M_impl.super__Vector_impl_data._M_start != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)&local_68,
             (long)(int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  for (lVar1 = 0;
      lVar1 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start; lVar1 = lVar1 + 1) {
    std::istream::_M_extract<long>((long *)is);
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88._M_impl.super__Vector_impl_data._M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,(char *)&local_88);
  if ((char)local_88._M_impl.super__Vector_impl_data._M_start != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ',') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \',\'");
  }
  local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::istream::operator>>((istream *)is,(int *)&local_50);
  std::operator>>(is,&local_8a);
  if (local_8a != ',') {
    Error_host("getarray(istream&): expected a \',\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != '(') {
    Error_host("getarray(istream&): expected a \'(\'");
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (long)(int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  lVar2 = 0;
  for (lVar1 = 0;
      lVar1 < (int)local_50.fr.super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start; lVar1 = lVar1 + 1) {
    std::istream::operator>>
              ((istream *)is,
               (int *)((long)local_88._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 4;
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_8a);
  if (local_8a != ')') {
    Error_host("getarray(istream&): expected a \')\'");
  }
  std::operator>>(is,&local_89);
  if (local_89 != ')') {
    Error_host("operator>>(istream&,RealDescriptor&): expected a \')\'");
  }
  RealDescriptor::RealDescriptor
            (&local_50,local_68._M_impl.super__Vector_impl_data._M_start,
             local_88._M_impl.super__Vector_impl_data._M_start,
             (int)((ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88._M_impl.super__Vector_impl_data._M_start) >> 2));
  RealDescriptor::operator=(rd,&local_50);
  RealDescriptor::~RealDescriptor(&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  return is;
}

Assistant:

std::istream&
operator>> (std::istream&   is,
            RealDescriptor& rd)
{
    char c;
    is >> c;
    if (c != '(')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \'(\'");
    Vector<Long> fmt;
    getarray(is, fmt);
    is >> c;
    if (c != ',')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \',\'");
    Vector<int> ord;
    getarray(is, ord);
    is >> c;
    if (c != ')')
        amrex::Error("operator>>(istream&,RealDescriptor&): expected a \')\'");
    rd = RealDescriptor(fmt.dataPtr(),ord.dataPtr(),ord.size());
    return is;
}